

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Nullable<CordRep_*>
absl::lts_20240722::NewTree(Nullable<const_char_*> data,size_t length,size_t alloc_hint)

{
  Nullable<CordRep_*> pCVar1;
  CordRep *pCVar2;
  undefined8 *puVar3;
  
  if (length == 0) {
    pCVar1 = (Nullable<CordRep_*>)0x0;
  }
  else {
    if (0xff3 < length) {
      pCVar2 = &cord_internal::CordRepFlat::NewImpl<4096ul>(0xff3)->super_CordRep;
      pCVar2->length = 0xff3;
      memcpy(pCVar2->storage,data,0xff3);
      if ((pCVar2->tag < 5) &&
         ((pCVar2->tag != 1 || (*(byte *)(*(long *)&pCVar2[1].refcount + 0xc) < 5)))) {
        puVar3 = (undefined8 *)absl::lts_20240722::cord_internal::CordRepBtree::CreateSlow(pCVar2);
      }
      else {
        puVar3 = (undefined8 *)operator_new(0x40);
        puVar3[1] = 0x100000300000002;
        *puVar3 = 0xff3;
        puVar3[2] = pCVar2;
      }
      pCVar1 = (Nullable<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepBtree::Append
                         (puVar3,length - 0xff3,data + 0xff3,0);
      return pCVar1;
    }
    pCVar1 = &cord_internal::CordRepFlat::NewImpl<4096ul>(length)->super_CordRep;
    ((CordRep *)&pCVar1->length)->length = length;
    memcpy(pCVar1->storage,data,length);
  }
  return pCVar1;
}

Assistant:

static absl::Nullable<CordRep*> NewTree(absl::Nullable<const char*> data,
                                        size_t length, size_t alloc_hint) {
  if (length == 0) return nullptr;
  return NewBtree(data, length, alloc_hint);
}